

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitpacking.cpp
# Opt level: O3

void duckdb_fastpforlib::internal::__fastunpack18(uint32_t *in,uint32_t *out)

{
  uint uVar1;
  uint uVar2;
  uint32_t *local_8;
  
  uVar1 = *in;
  uVar2 = in[1];
  *out = uVar1 & 0x3ffff;
  local_8 = in + 1;
  out[1] = (uVar2 & 0xf) << 0xe | uVar1 >> 0x12;
  Unroller<(unsigned_short)18,_(unsigned_short)2>::Unpack(&local_8,out);
  return;
}

Assistant:

void __fastunpack18(const uint32_t *__restrict in, uint32_t *__restrict out) {
	Unroller<18>::Unpack(in, out);
}